

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  char *pcVar1;
  Request *pRVar2;
  bool bVar3;
  int iVar4;
  __ssize_t _Var5;
  size_t sVar6;
  pointer pcVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  long lVar10;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *__n;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *__n_00;
  Request **__lineptr;
  cmatch m;
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  Request *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8 [72];
  Request *local_880;
  _Base_ptr local_878;
  undefined1 local_870 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_840;
  _Rb_tree_node_base local_830 [64];
  
  local_870._32_8_ = &local_840;
  local_870._8_8_ = local_830;
  local_870._16_8_ = 0x800;
  local_870._24_8_ = (pointer)0x0;
  local_870._40_8_ = 0;
  local_840._M_local_buf[0] = '\0';
  local_8c8._24_8_ = res;
  local_870._0_8_ = strm;
  _Var5 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_870,(char **)strm,(size_t *)req,
                     (FILE *)local_870._32_8_);
  if ((char)_Var5 == '\0') {
    bVar3 = false;
  }
  else {
    if (read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
        re_abi_cxx11_ == '\0') goto LAB_001119cd;
    while( true ) {
      local_8c8._48_8_ = 0;
      local_8c8._56_8_ = 0;
      local_8c8._32_8_ = (pointer)0x0;
      local_8c8._40_8_ = 0;
      puVar8 = (undefined8 *)(local_870 + 0x20);
      if (local_870._40_8_ == 0) {
        puVar8 = (undefined8 *)(local_870 + 8);
      }
      pcVar1 = (char *)*puVar8;
      sVar6 = strlen(pcVar1);
      bVar3 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (pcVar1,pcVar1 + sVar6,
                         (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)(local_8c8 + 0x20),
                         &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                          ::re_abi_cxx11_,0);
      if (!bVar3) break;
      lVar10 = local_8c8._40_8_ - local_8c8._32_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
        pcVar7 = (pointer)(local_8c8._32_8_ + lVar10 + -0x48);
      }
      else {
        pcVar7 = (pointer)(local_8c8._32_8_ + 0x18);
      }
      if (pcVar7[0x10] == '\x01') {
        local_8d8 = (Request *)local_8c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
      }
      else {
        local_8d0 = 0;
        local_8c8[0] = 0;
        local_8d8 = (Request *)local_8c8;
      }
      std::__cxx11::string::operator=((string *)local_8c8._24_8_,(string *)&local_8d8);
      if (local_8d8 != (Request *)local_8c8) {
        operator_delete(local_8d8,CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
      }
      lVar10 = local_8c8._40_8_ - local_8c8._32_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
        pcVar7 = (pointer)(local_8c8._32_8_ + lVar10 + -0x48);
      }
      else {
        pcVar7 = (pointer)(local_8c8._32_8_ + 0x30);
      }
      if (pcVar7[0x10] == '\x01') {
        local_8d8 = (Request *)local_8c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
      }
      else {
        local_8d0 = 0;
        local_8c8[0] = 0;
        local_8d8 = (Request *)local_8c8;
      }
      pRVar2 = local_8d8;
      local_8c8._16_8_ = __errno_location();
      iVar4 = *(int *)local_8c8._16_8_;
      *(int *)local_8c8._16_8_ = 0;
      lVar10 = strtol((char *)pRVar2,(char **)&local_880,10);
      if (local_880 == pRVar2) {
        std::__throw_invalid_argument("stoi");
LAB_00111a30:
        uVar9 = std::__throw_out_of_range("stoi");
        __cxa_guard_abort(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                           ::re_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_870._32_8_ != &local_840) {
          operator_delete((void *)local_870._32_8_,
                          CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0])
                          + 1);
        }
        _Unwind_Resume(uVar9);
      }
      if (((int)lVar10 != lVar10) || (*(int *)local_8c8._16_8_ == 0x22)) goto LAB_00111a30;
      if (*(int *)local_8c8._16_8_ == 0) {
        *(int *)local_8c8._16_8_ = iVar4;
      }
      *(int *)(local_8c8._24_8_ + 0x20) = (int)lVar10;
      req = (Request *)local_8c8;
      if (local_8d8 != req) {
        operator_delete(local_8d8,CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
      }
      __stream = (FILE *)(local_8c8._40_8_ - local_8c8._32_8_);
      if ((__stream == (FILE *)0x0) ||
         (0xfffffffffffffffb < ((long)__stream >> 3) * -0x5555555555555555 - 7U)) {
        pcVar7 = (pointer)(local_8c8._32_8_ + (long)__stream) + -0x48;
      }
      else {
        pcVar7 = (pointer)(local_8c8._32_8_ + 0x48);
      }
      if (pcVar7[0x10] == '\x01') {
        local_8d8 = (Request *)local_8c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
      }
      else {
        local_8d0 = 0;
        local_8c8[0] = 0;
        local_8d8 = req;
      }
      local_878 = (_Base_ptr)(local_8c8._24_8_ + 0x28);
      __lineptr = &local_8d8;
      std::__cxx11::string::operator=((string *)local_878,(string *)&local_8d8);
      __n_00 = extraout_RDX;
      if (local_8d8 != req) {
        __lineptr = (Request **)(CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
        operator_delete(local_8d8,(ulong)__lineptr);
        __n_00 = extraout_RDX_00;
      }
      bVar3 = true;
      if (*(int *)(local_8c8._24_8_ + 0x20) != 100) goto LAB_00111964;
LAB_001116ea:
      _Var5 = detail::stream_line_reader::getline
                        ((stream_line_reader *)local_870,(char **)__lineptr,__n_00,__stream);
      if ((char)_Var5 == '\0') {
LAB_00111961:
        bVar3 = false;
        goto LAB_00111964;
      }
      _Var5 = detail::stream_line_reader::getline
                        ((stream_line_reader *)local_870,(char **)__lineptr,__n,__stream);
      if ((char)_Var5 == '\0') goto LAB_00111961;
      puVar8 = (undefined8 *)(local_870 + 0x20);
      if (local_870._40_8_ == 0) {
        puVar8 = (undefined8 *)(local_870 + 8);
      }
      pcVar1 = (char *)*puVar8;
      sVar6 = strlen(pcVar1);
      bVar3 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (pcVar1,pcVar1 + sVar6,
                         (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)(local_8c8 + 0x20),
                         &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                          ::re_abi_cxx11_,0);
      if (!bVar3) goto LAB_00111961;
      lVar10 = local_8c8._40_8_ - local_8c8._32_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
        pcVar7 = (pointer)(local_8c8._32_8_ + lVar10 + -0x48);
      }
      else {
        pcVar7 = (pointer)(local_8c8._32_8_ + 0x18);
      }
      if (pcVar7[0x10] == '\x01') {
        local_8d8 = req;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
      }
      else {
        local_8d0 = 0;
        local_8c8[0] = 0;
        local_8d8 = req;
      }
      std::__cxx11::string::operator=((string *)local_8c8._24_8_,(string *)&local_8d8);
      if (local_8d8 != req) {
        operator_delete(local_8d8,CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
      }
      lVar10 = local_8c8._40_8_ - local_8c8._32_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
        pcVar7 = (pointer)(local_8c8._32_8_ + lVar10 + -0x48);
      }
      else {
        pcVar7 = (pointer)(local_8c8._32_8_ + 0x30);
      }
      if (pcVar7[0x10] == '\x01') {
        local_8d8 = req;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
      }
      else {
        local_8d0 = 0;
        local_8c8[0] = 0;
        local_8d8 = req;
      }
      pRVar2 = local_8d8;
      iVar4 = *(int *)local_8c8._16_8_;
      *(int *)local_8c8._16_8_ = 0;
      lVar10 = strtol((char *)local_8d8,(char **)&local_880,10);
      if (local_880 != pRVar2) {
        if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*(int *)local_8c8._16_8_ == 0x22))
        goto LAB_001119c1;
        if (*(int *)local_8c8._16_8_ == 0) {
          *(int *)local_8c8._16_8_ = iVar4;
        }
        *(int *)(local_8c8._24_8_ + 0x20) = (int)lVar10;
        if (local_8d8 != req) {
          operator_delete(local_8d8,CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
        }
        __stream = (FILE *)(local_8c8._40_8_ - local_8c8._32_8_);
        if ((__stream == (FILE *)0x0) ||
           (0xfffffffffffffffb < ((long)__stream >> 3) * -0x5555555555555555 - 7U)) {
          pcVar7 = (pointer)(local_8c8._32_8_ + (long)__stream) + -0x48;
        }
        else {
          pcVar7 = (pointer)(local_8c8._32_8_ + 0x48);
        }
        local_8d8 = (Request *)local_8c8;
        if (pcVar7[0x10] == '\x01') {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_8d8,*(undefined8 *)pcVar7,*(undefined8 *)(pcVar7 + 8));
        }
        else {
          local_8d0 = 0;
          local_8c8[0] = 0;
        }
        __lineptr = &local_8d8;
        std::__cxx11::string::operator=((string *)local_878,(string *)&local_8d8);
        __n_00 = extraout_RDX_01;
        if (local_8d8 != (Request *)local_8c8) {
          __lineptr = (Request **)(CONCAT71(local_8c8._1_7_,local_8c8[0]) + 1);
          operator_delete(local_8d8,(ulong)__lineptr);
          __n_00 = extraout_RDX_02;
        }
        if (*(int *)(local_8c8._24_8_ + 0x20) != 100) {
          bVar3 = true;
          goto LAB_00111964;
        }
        goto LAB_001116ea;
      }
      std::__throw_invalid_argument("stoi");
LAB_001119c1:
      std::__throw_out_of_range("stoi");
LAB_001119cd:
      iVar4 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                   ::re_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                    ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                             ::re_abi_cxx11_);
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)req);
    bVar3 = iVar4 == 0;
LAB_00111964:
    if ((pointer)local_8c8._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_8c8._32_8_,local_8c8._48_8_ - local_8c8._32_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._32_8_ != &local_840) {
    operator_delete((void *)local_870._32_8_,
                    CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

inline bool ClientImpl::read_response_line(Stream &strm, const Request &req,
											   Response &res) {
		std::array<char, 2048> buf;

		detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

		if (!line_reader.getline()) { return false; }

		const static std::regex re("(HTTP/1\\.[01]) (\\d{3}) (.*?)\r\n");

		std::cmatch m;
		if (!std::regex_match(line_reader.ptr(), m, re)) {
			return req.method == "CONNECT";
		}
		res.version = std::string(m[1]);
		res.status = std::stoi(std::string(m[2]));
		res.reason = std::string(m[3]);

		// Ignore '100 Continue'
		while (res.status == 100) {
			if (!line_reader.getline()) { return false; } // CRLF
			if (!line_reader.getline()) { return false; } // next response line

			if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
			res.version = std::string(m[1]);
			res.status = std::stoi(std::string(m[2]));
			res.reason = std::string(m[3]);
		}

		return true;
	}